

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O3

vm_obj_id_t __thiscall
TadsHttpReqResult::prep_event_obj(TadsHttpReqResult *this,int *argc,int *evt_type)

{
  byte bVar1;
  vm_globalvar_t *pvVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_datatype_t *pvVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  size_t sVar9;
  byte *pbVar10;
  char *pcVar11;
  size_t charset_name_len;
  
  pcVar11 = this->loc;
  if (pcVar11 == (char *)0x0) {
    sVar9 = 0;
  }
  else {
    sVar9 = strlen(pcVar11);
  }
  CVmRun::push_string(&G_interpreter_X,pcVar11,sVar9);
  pcVar11 = this->hdrs;
  if (pcVar11 == (char *)0x0) {
    sVar9 = 0;
  }
  else {
    sVar9 = strlen(pcVar11);
  }
  CVmRun::push_string(&G_interpreter_X,pcVar11,sVar9);
  if (this->reply == (CVmDataSource *)0x0) {
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_NIL;
  }
  else {
    pbVar10 = (byte *)find_header(this,"content-type");
    iVar7 = 3;
    vVar8 = 0;
    if ((pbVar10 != (byte *)0x0) && (vVar8 = 0, pbVar10[4] == 0x2f && *(int *)pbVar10 == 0x74786574)
       ) {
      do {
        for (; bVar1 = *pbVar10, bVar1 < 0x3b; pbVar10 = pbVar10 + 1) {
          if (((bVar1 == 0) || (bVar1 == 10)) || (bVar1 == 0xd)) {
            charset_name_len = 10;
            pcVar11 = "ISO-8859-1";
            goto LAB_0020147f;
          }
LAB_00201454:
        }
        if (bVar1 != 0x3b) goto LAB_00201454;
        pbVar10 = pbVar10 + 9;
        do {
          pcVar11 = (char *)pbVar10;
          if ((char)((byte *)pcVar11)[-8] < 1) break;
          iVar7 = isspace((int)(char)((byte *)pcVar11)[-8]);
          pbVar10 = (byte *)pcVar11 + 1;
        } while (iVar7 != 0);
        pbVar10 = (byte *)pcVar11 + -8;
      } while (*(long *)((byte *)pcVar11 + -8) != 0x3d74657372616863);
      charset_name_len = 0;
      while( true ) {
        bVar1 = ((byte *)pcVar11)[charset_name_len];
        if ((((ulong)bVar1 < 0x3c) && ((0x800000000002400U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
           ((-1 < (char)bVar1 && (iVar7 = isspace((int)(char)bVar1), iVar7 != 0)))) break;
        charset_name_len = charset_name_len + 1;
      }
LAB_0020147f:
      vVar8 = CVmObjCharSet::create(0,pcVar11,charset_name_len);
      iVar7 = 1;
    }
    (*this->reply->_vptr_CVmDataSource[8])(this->reply,0,0);
    vVar8 = CVmObjFile::create(0,(CVmNetFile *)0x0,vVar8,this->reply,iVar7,1,1);
    pvVar6 = sp_;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar6->val).obj = vVar8;
    this->reply = (CVmDataSource *)0x0;
  }
  pvVar6 = sp_;
  vVar8 = this->status;
  pvVar4 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar4 = VM_INT;
  (pvVar6->val).obj = vVar8;
  pvVar6 = sp_;
  pvVar2 = this->idg;
  uVar5 = *(undefined4 *)&(pvVar2->val).field_0x4;
  aVar3 = (pvVar2->val).val;
  sp_ = sp_ + 1;
  pvVar6->typ = (pvVar2->val).typ;
  *(undefined4 *)&pvVar6->field_0x4 = uVar5;
  pvVar6->val = aVar3;
  *argc = 5;
  *evt_type = 5;
  return G_predef_X.net_reply_event;
}

Assistant:

virtual vm_obj_id_t prep_event_obj(VMG_ int *argc, int *evt_type)
    {
        /* push the location string (or nil) */
        G_interpreter->push_string(vmg_ loc, loc != 0 ? strlen(loc) : 0);

        /* push the header string (or nil) */
        G_interpreter->push_string(vmg_ hdrs, hdrs != 0 ? strlen(hdrs) : 0);

        /* if we have reply data, push it as a File object */
        if (reply != 0)
        {
            /*
             *   Look for a content-type header, to determine the format of
             *   the reply body.  If the header starts with "text/", it's a
             *   text type; otherwise it's a binary type.
             */
            int mode = VMOBJFILE_MODE_RAW;
            const char *charset = "ISO-8859-1";
            size_t cslen = 10;
            const char *ct = find_header("content-type");
            if (ct != 0 && memcmp(ct, "text/", 5) == 0)
            {
                /* it's a textual type */
                mode = VMOBJFILE_MODE_TEXT;

                /* look for a 'charset' attribute */
                for (;;)
                {
                    /* scan ahead to the next ';' before end of line */
                    for ( ; *ct != '\0' && *ct != '\r'
                            && *ct != '\n' && *ct != ';' ; ++ct) ;
                    if (*ct != ';')
                        break;

                    /* skip the ';' and spaces */
                    for (ct += 1 ; *ct != '\0' && is_space(*ct) ; ++ct) ;

                    /* check for "charset" */
                    if (memcmp(ct, "charset=", 8) == 0)
                    {
                        /* note the "charset" attribute, and find the end */
                        for (ct += 8, charset = ct ;
                             *ct != '\r' && *ct != '\n' && *ct != ';'
                                 && !is_space(*ct) ; ++ct) ;

                        /* note the character set name length */
                        cslen = ct - charset;

                        /* look no further */
                        break;
                    }
                }
            }

            /* if it's a text-mode file, create a character mapper */
            vm_obj_id_t csobj = VM_INVALID_OBJ;
            if (mode == VMOBJFILE_MODE_TEXT)
                csobj = CVmObjCharSet::create(vmg_ FALSE, charset, cslen);

            /* seek to the beginning of the reply stream */
            reply->seek(0, OSFSK_SET);

            /* create a File object from the Data Source */
            vm_obj_id_t fileobj = CVmObjFile::create(
                vmg_ FALSE, 0, csobj, reply, mode,
                VMOBJFILE_ACCESS_READ, TRUE);
            
            /* push the file object */
            G_interpreter->push_obj(vmg_ fileobj);

            /* 
             *   the File object owns the data source, which owns the reply
             *   stream, so forget about the reply stream
             */
            reply = 0;
        }
        else
        {
            /* no reply data - push nil */
            G_interpreter->push_nil(vmg0_);
        }

        /* push the network status code */
        G_interpreter->push_int(vmg_ status);

        /* push the caller's ID value */
        G_stk->push(&idg->val);

        /* relay our added argument count to the caller */
        *argc = 5;

        /* set the event type to NetEvReply (5 - see include/tadsnet.h) */
        *evt_type = 5;

        /* the event subclass is NetReplyEvent */
        return G_predef->net_reply_event;
    }